

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_check_utf8(uchar *state,uchar *buf,size_t len)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  bVar1 = *state;
  uVar3 = (uint)bVar1;
  if (len != 0) {
    sVar2 = 0;
    do {
      bVar1 = buf[sVar2];
      if ((char)uVar3 == '\0') {
        if ((char)bVar1 < '\0') {
          if ((byte)(bVar1 + 0xb) < 0xcd) {
            return 1;
          }
          uVar3 = 0x8c;
          if (0xdf < bVar1) {
            uVar3 = bVar1 & 0x1f;
            goto LAB_00103a51;
          }
        }
        else {
          uVar3 = 0;
        }
      }
      else {
        uVar4 = uVar3 & 0xf0;
        if (bVar1 <= uVar4 && uVar4 != bVar1) {
          return 1;
        }
        if (uVar4 + (uVar3 & 0xc) * 4 + 0x10 <= (uint)bVar1) {
          return 1;
        }
        uVar3 = (uVar3 & 3) + 0x15;
LAB_00103a51:
        uVar3 = (uint)e0f4[uVar3];
      }
      bVar1 = (byte)uVar3;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  *state = bVar1;
  return 0;
}

Assistant:

int
lws_check_utf8(unsigned char *state, unsigned char *buf, size_t len)
{
	unsigned char s = *state;

	while (len--) {
		unsigned char c = *buf++;

		if (!s) {
			if (c >= 0x80) {
				if (c < 0xc2 || c > 0xf4)
					return 1;
				if (c < 0xe0)
					s = 0x80 | ((4 - 1) << 2);
				else
					s = e0f4[c - 0xe0];
			}
		} else {
			if (c < (s & 0xf0) ||
			    c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
				return 1;
			s = e0f4[21 + (s & 3)];
		}
	}

	*state = s;

	return 0;
}